

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

void __thiscall Rml::ElementStyle::ElementStyle(ElementStyle *this,Element *_element)

{
  Element *_element_local;
  ElementStyle *this_local;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->classes);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
  ::flat_map(&this->pseudo_classes);
  PropertyDictionary::PropertyDictionary(&this->inline_properties);
  ::std::shared_ptr<const_Rml::ElementDefinition>::shared_ptr(&this->definition);
  PropertyIdSet::PropertyIdSet(&this->dirty_properties);
  this->element = _element;
  return;
}

Assistant:

ElementStyle::ElementStyle(Element* _element)
{
	element = _element;
}